

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffgload.c
# Opt level: O3

FT_Error cff_get_glyph_data(TT_Face face,FT_UInt glyph_index,FT_Byte **pointer,FT_ULong *length)

{
  FT_Incremental_InterfaceRec *pFVar1;
  FT_Error FVar2;
  undefined1 local_30 [8];
  FT_Data data;
  
  pFVar1 = ((face->root).internal)->incremental_interface;
  if (pFVar1 != (FT_Incremental_InterfaceRec *)0x0) {
    FVar2 = (*pFVar1->funcs->get_glyph_data)(pFVar1->object,glyph_index,(FT_Data *)local_30);
    *pointer = (FT_Byte *)local_30;
    *length = (long)(int)data.pointer;
    return FVar2;
  }
  FVar2 = cff_index_access_element
                    ((CFF_Index)((long)(face->extra).data + 0x538),glyph_index,pointer,length);
  return FVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_get_glyph_data( TT_Face    face,
                      FT_UInt    glyph_index,
                      FT_Byte**  pointer,
                      FT_ULong*  length )
  {
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    /* For incremental fonts get the character data using the */
    /* callback function.                                     */
    if ( face->root.internal->incremental_interface )
    {
      FT_Data   data;
      FT_Error  error =
                  face->root.internal->incremental_interface->funcs->get_glyph_data(
                    face->root.internal->incremental_interface->object,
                    glyph_index, &data );


      *pointer = (FT_Byte*)data.pointer;
      *length  = (FT_ULong)data.length;

      return error;
    }
    else
#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    {
      CFF_Font  cff = (CFF_Font)(face->extra.data);


      return cff_index_access_element( &cff->charstrings_index, glyph_index,
                                       pointer, length );
    }
  }